

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

void open_via_helppath(char *name,char *dir)

{
  int iVar1;
  size_t sVar2;
  t_symbol *name_00;
  t_symbol *dir_00;
  char *local_c08;
  int local_bfc;
  int fd;
  char *usedir;
  char *basename;
  char dirbuf [1000];
  char local_7f8 [8];
  char newname [1000];
  char local_408 [8];
  char realname [1000];
  char *dir_local;
  char *name_local;
  
  local_c08 = dir;
  if (*dir == '\0') {
    local_c08 = "./";
  }
  strncpy(local_408,name,0x3de);
  realname[0x3d6] = '\0';
  sVar2 = strlen(local_408);
  if (3 < sVar2) {
    sVar2 = strlen(local_408);
    iVar1 = strcmp(newname + sVar2 + 0x3e5,".pd");
    if (iVar1 == 0) {
      sVar2 = strlen(local_408);
      newname[sVar2 + 0x3e5] = '\0';
    }
  }
  strncpy(local_7f8,local_408,0x3de);
  strcat(local_408,"-help.pd");
  local_bfc = do_open_via_path(local_c08,local_408,"",(char *)&basename,&usedir,1000,0,
                               (pd_maininstance.pd_stuff)->st_helppath);
  if (local_bfc < 0) {
    strcpy(local_408,"help-");
    strncat(local_408,name,0x3de);
    realname[0x3df] = '\0';
    local_bfc = do_open_via_path(local_c08,local_408,"",(char *)&basename,&usedir,1000,0,
                                 (pd_maininstance.pd_stuff)->st_helppath);
    if (local_bfc < 0) {
      post("sorry, couldn\'t find help patch for \"%s\"",local_7f8);
      return;
    }
  }
  close(local_bfc);
  name_00 = gensym(usedir);
  dir_00 = gensym((char *)&basename);
  glob_evalfile((t_pd *)0x0,name_00,dir_00);
  return;
}

Assistant:

void open_via_helppath(const char *name, const char *dir)
{
    char realname[MAXPDSTRING], newname[MAXPDSTRING], dirbuf[MAXPDSTRING], *basename;
        /* make up a silly "dir" if none is supplied */
    const char *usedir = (*dir ? dir : "./");
    int fd;

        /* 1. "objectname-help.pd" */
    strncpy(realname, name, MAXPDSTRING-10);
    realname[MAXPDSTRING-10] = 0;
    if (strlen(realname) > 3 && !strcmp(realname+strlen(realname)-3, ".pd"))
        realname[strlen(realname)-3] = 0;
    strncpy(newname, realname, MAXPDSTRING-10);
    strcat(realname, "-help.pd");
    if ((fd = do_open_via_path(usedir, realname, "", dirbuf, &basename,
        MAXPDSTRING, 0, STUFF->st_helppath)) >= 0)
            goto gotone;

        /* 2. "help-objectname.pd" */
    strcpy(realname, "help-");
    strncat(realname, name, MAXPDSTRING-10);
    realname[MAXPDSTRING-1] = 0;
    if ((fd = do_open_via_path(usedir, realname, "", dirbuf, &basename,
        MAXPDSTRING, 0, STUFF->st_helppath)) >= 0)
            goto gotone;
    post("sorry, couldn't find help patch for \"%s\"", newname);
    return;
gotone:
    close (fd);
    glob_evalfile(0, gensym((char*)basename), gensym(dirbuf));
}